

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

void wallet::SetPragma(sqlite3 *db,string *key,string *value,string *err_msg)

{
  long lVar1;
  int iVar2;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  char **args_1;
  long in_FS_OFFSET;
  undefined1 local_70 [8];
  string local_68;
  string stmt_text;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&stmt_text,(tinyformat *)"PRAGMA %s = %s",(char *)key,value,in_R8);
  args_1 = (char **)0x0;
  iVar2 = sqlite3_exec(db,stmt_text._M_dataplus._M_p,0,0);
  if (iVar2 == 0) {
    std::__cxx11::string::~string((string *)&stmt_text);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70 = (undefined1  [8])sqlite3_errstr(iVar2);
    tinyformat::format<std::__cxx11::string,char_const*>
              ((string *)(local_70 + 8),(tinyformat *)"SQLiteDatabase: %s: %s\n",(char *)err_msg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,args_1)
    ;
    std::runtime_error::runtime_error(this,(string *)(local_70 + 8));
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

static void SetPragma(sqlite3* db, const std::string& key, const std::string& value, const std::string& err_msg)
{
    std::string stmt_text = strprintf("PRAGMA %s = %s", key, value);
    int ret = sqlite3_exec(db, stmt_text.c_str(), nullptr, nullptr, nullptr);
    if (ret != SQLITE_OK) {
        throw std::runtime_error(strprintf("SQLiteDatabase: %s: %s\n", err_msg, sqlite3_errstr(ret)));
    }
}